

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_5x52_impl.h
# Opt level: O0

void secp256k1_fe_impl_negate_unchecked(secp256k1_fe *r,secp256k1_fe *a,int m)

{
  int in_EDX;
  long *in_RSI;
  long *in_RDI;
  
  if ((ulong)((long)(in_EDX + 1) * 0x1ffffdfffff85e) < (ulong)((long)in_EDX * 0x1ffffffffffffe)) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/field_5x52_impl.h"
            ,0x134,
            "test condition failed: 0xFFFFEFFFFFC2FULL * 2 * (m + 1) >= 0xFFFFFFFFFFFFFULL * 2 * m")
    ;
    abort();
  }
  if ((ulong)((long)(in_EDX + 1) * 0x1ffffffffffffe) < (ulong)((long)in_EDX * 0x1ffffffffffffe)) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/field_5x52_impl.h"
            ,0x135,
            "test condition failed: 0xFFFFFFFFFFFFFULL * 2 * (m + 1) >= 0xFFFFFFFFFFFFFULL * 2 * m")
    ;
    abort();
  }
  if ((ulong)((long)(in_EDX + 1) * 0x1fffffffffffe) < (ulong)((long)in_EDX * 0x1fffffffffffe)) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/field_5x52_impl.h"
            ,0x136,
            "test condition failed: 0x0FFFFFFFFFFFFULL * 2 * (m + 1) >= 0x0FFFFFFFFFFFFULL * 2 * m")
    ;
    abort();
  }
  *in_RDI = (long)(in_EDX + 1) * 0x1ffffdfffff85e - *in_RSI;
  in_RDI[1] = (long)(in_EDX + 1) * 0x1ffffffffffffe - in_RSI[1];
  in_RDI[2] = (long)(in_EDX + 1) * 0x1ffffffffffffe - in_RSI[2];
  in_RDI[3] = (long)(in_EDX + 1) * 0x1ffffffffffffe - in_RSI[3];
  in_RDI[4] = (long)(in_EDX + 1) * 0x1fffffffffffe - in_RSI[4];
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_impl_negate_unchecked(secp256k1_fe *r, const secp256k1_fe *a, int m) {
    /* For all legal values of m (0..31), the following properties hold: */
    VERIFY_CHECK(0xFFFFEFFFFFC2FULL * 2 * (m + 1) >= 0xFFFFFFFFFFFFFULL * 2 * m);
    VERIFY_CHECK(0xFFFFFFFFFFFFFULL * 2 * (m + 1) >= 0xFFFFFFFFFFFFFULL * 2 * m);
    VERIFY_CHECK(0x0FFFFFFFFFFFFULL * 2 * (m + 1) >= 0x0FFFFFFFFFFFFULL * 2 * m);

    /* Due to the properties above, the left hand in the subtractions below is never less than
     * the right hand. */
    r->n[0] = 0xFFFFEFFFFFC2FULL * 2 * (m + 1) - a->n[0];
    r->n[1] = 0xFFFFFFFFFFFFFULL * 2 * (m + 1) - a->n[1];
    r->n[2] = 0xFFFFFFFFFFFFFULL * 2 * (m + 1) - a->n[2];
    r->n[3] = 0xFFFFFFFFFFFFFULL * 2 * (m + 1) - a->n[3];
    r->n[4] = 0x0FFFFFFFFFFFFULL * 2 * (m + 1) - a->n[4];
}